

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevoluteSpherical::ChLinkRevoluteSpherical
          (ChLinkRevoluteSpherical *this,ChLinkRevoluteSpherical *other)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  ChLink::ChLink(&this->super_ChLink,&other->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkRevoluteSpherical_00b45468;
  (this->m_pos1).m_data[0] = 0.0;
  (this->m_pos1).m_data[1] = 0.0;
  (this->m_pos1).m_data[2] = 0.0;
  (this->m_pos2).m_data[0] = 0.0;
  (this->m_pos2).m_data[1] = 0.0;
  (this->m_pos2).m_data[2] = 0.0;
  (this->m_dir1).m_data[0] = 0.0;
  (this->m_dir1).m_data[1] = 0.0;
  (this->m_dir1).m_data[2] = 0.0;
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dist);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dot);
  (this->super_ChLink).Body1 = (other->super_ChLink).Body1;
  (this->super_ChLink).Body2 = (other->super_ChLink).Body2;
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system =
       (other->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system;
  if (other != this) {
    (this->m_pos1).m_data[0] = (other->m_pos1).m_data[0];
    (this->m_pos1).m_data[1] = (other->m_pos1).m_data[1];
    (this->m_pos1).m_data[2] = (other->m_pos1).m_data[2];
    (this->m_pos2).m_data[0] = (other->m_pos2).m_data[0];
    (this->m_pos2).m_data[1] = (other->m_pos2).m_data[1];
    (this->m_pos2).m_data[2] = (other->m_pos2).m_data[2];
    (this->m_dir1).m_data[0] = (other->m_dir1).m_data[0];
    (this->m_dir1).m_data[1] = (other->m_dir1).m_data[1];
    (this->m_dir1).m_data[2] = (other->m_dir1).m_data[2];
  }
  this->m_dist = other->m_dist;
  this->m_cur_dist = other->m_cur_dist;
  this->m_cur_dot = other->m_cur_dot;
  iVar1 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar2 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var,iVar1),
             (ChVariables *)CONCAT44(extraout_var_00,iVar2));
  iVar1 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar2 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_01,iVar1),
             (ChVariables *)CONCAT44(extraout_var_02,iVar2));
  this->m_multipliers[0] = other->m_multipliers[0];
  this->m_multipliers[1] = other->m_multipliers[1];
  return;
}

Assistant:

ChLinkRevoluteSpherical::ChLinkRevoluteSpherical(const ChLinkRevoluteSpherical& other) : ChLink(other) {
    Body1 = other.Body1;
    Body2 = other.Body2;
    system = other.system;

    m_pos1 = other.m_pos1;
    m_pos2 = other.m_pos2;
    m_dir1 = other.m_dir1;
    m_dist = other.m_dist;
    m_cur_dist = other.m_cur_dist;
    m_cur_dot = other.m_cur_dot;

    m_cnstr_dist.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    m_cnstr_dot.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());

    m_multipliers[0] = other.m_multipliers[0];
    m_multipliers[1] = other.m_multipliers[1];
}